

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.h
# Opt level: O3

NodeData __thiscall
google::protobuf::compiler::
SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::DFS
          (SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator> *this,
          Descriptor *descriptor)

{
  _Rb_tree_header *p_Var1;
  pointer *pppDVar2;
  uint uVar3;
  iterator iVar4;
  iterator __position;
  SCC *this_00;
  pointer ppDVar5;
  iterator __position_00;
  long lVar6;
  pointer *pppSVar7;
  int iVar8;
  LogMessage *pLVar9;
  _Base_ptr p_Var10;
  pointer puVar11;
  mapped_type *pmVar12;
  ulong uVar13;
  pointer ppDVar14;
  _Base_ptr p_Var15;
  int iVar16;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  Descriptor *extraout_RDX_01;
  Descriptor *extraout_RDX_02;
  Descriptor *extraout_RDX_03;
  Descriptor *extraout_RDX_04;
  Descriptor *extraout_RDX_05;
  Descriptor *pDVar17;
  Descriptor *extraout_RDX_06;
  Descriptor *extraout_RDX_07;
  __normal_iterator<const_google::protobuf::Descriptor_**,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
  __i;
  pointer ppDVar18;
  Descriptor *pDVar19;
  undefined8 *puVar20;
  NodeData NVar21;
  pair<std::_Rb_tree_iterator<const_google::protobuf::compiler::SCC_*>,_bool> pVar22;
  Descriptor *dep;
  Descriptor *scc_desc;
  set<const_google::protobuf::compiler::SCC_*,_std::less<const_google::protobuf::compiler::SCC_*>,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
  seen;
  LogFinisher local_d9;
  mapped_type *local_d8;
  SCC *local_d0;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  local_c8;
  pointer local_b0;
  pointer local_a8;
  vector<google::protobuf::compiler::SCC_const*,std::allocator<google::protobuf::compiler::SCC_const*>>
  *local_a0;
  LogMessage local_98;
  _Rb_tree<const_google::protobuf::compiler::SCC_*,_const_google::protobuf::compiler::SCC_*,_std::_Identity<const_google::protobuf::compiler::SCC_*>,_std::less<const_google::protobuf::compiler::SCC_*>,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
  local_60;
  
  p_Var10 = (this->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->cache_)._M_t._M_impl.super__Rb_tree_header;
  p_Var15 = &p_Var1->_M_header;
  local_d0 = (SCC *)descriptor;
  if (p_Var10 != (_Base_ptr)0x0) {
    do {
      if (*(Descriptor **)(p_Var10 + 1) >= descriptor) {
        p_Var15 = p_Var10;
      }
      p_Var10 = (&p_Var10->_M_left)[*(Descriptor **)(p_Var10 + 1) < descriptor];
    } while (p_Var10 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var15 != p_Var1) && (*(Descriptor **)(p_Var15 + 1) <= descriptor)) {
      internal::LogMessage::LogMessage
                (&local_98,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/scc.h"
                 ,0x5c);
      pLVar9 = internal::LogMessage::operator<<
                         (&local_98,"CHECK failed: (cache_.count(descriptor)) == (0): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_60,pLVar9);
      internal::LogMessage::~LogMessage(&local_98);
    }
  }
  local_d8 = std::
             map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData>_>_>
             ::operator[](&this->cache_,(key_type *)&local_d0);
  uVar3 = this->index_;
  pDVar17 = (Descriptor *)(ulong)uVar3;
  this->index_ = uVar3 + 1;
  local_d8->lowlink = uVar3;
  local_d8->index = uVar3;
  iVar4._M_current =
       (this->stack_).
       super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->stack_).
      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
    ::_M_realloc_insert<google::protobuf::Descriptor_const*const&>
              ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                *)&this->stack_,iVar4,(Descriptor **)&local_d0);
    pDVar17 = extraout_RDX;
  }
  else {
    *iVar4._M_current = (Descriptor *)local_d0;
    pppDVar2 = &(this->stack_).
                super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppDVar2 = *pppDVar2 + 1;
  }
  js::anon_unknown_0::DepsGenerator::operator()
            ((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
              *)&local_60,(DepsGenerator *)local_d0,pDVar17);
  if ((undefined8 *)local_60._M_impl._0_8_ !=
      (undefined8 *)
      CONCAT44(local_60._M_impl.super__Rb_tree_header._M_header._4_4_,
               local_60._M_impl.super__Rb_tree_header._M_header._M_color)) {
    puVar20 = (undefined8 *)local_60._M_impl._0_8_;
    do {
      pDVar17 = (Descriptor *)*puVar20;
      local_c8.
      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pDVar17;
      if (pDVar17 == (Descriptor *)0x0) {
        internal::LogMessage::LogMessage
                  (&local_98,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/scc.h"
                   ,0x66);
        pLVar9 = internal::LogMessage::operator<<(&local_98,"CHECK failed: dep: ");
        internal::LogFinisher::operator=(&local_d9,pLVar9);
        internal::LogMessage::~LogMessage(&local_98);
      }
      p_Var10 = (this->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var15 = &p_Var1->_M_header;
      if (p_Var10 == (_Base_ptr)0x0) {
LAB_00260a40:
        NVar21 = DFS(this,pDVar17);
        iVar16 = NVar21.lowlink;
        iVar8 = local_d8->lowlink;
LAB_00260a57:
        if (iVar8 < iVar16) {
          iVar16 = iVar8;
        }
        local_d8->lowlink = iVar16;
      }
      else {
        do {
          if (*(Descriptor **)(p_Var10 + 1) >= pDVar17) {
            p_Var15 = p_Var10;
          }
          p_Var10 = (&p_Var10->_M_left)[*(Descriptor **)(p_Var10 + 1) < pDVar17];
        } while (p_Var10 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var15 == p_Var1) ||
           (pDVar17 < (Descriptor *)((_Rb_tree_header *)p_Var15)->_M_node_count)) goto LAB_00260a40;
        pmVar12 = std::
                  map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData>_>_>
                  ::operator[](&this->cache_,(key_type *)&local_c8);
        if (pmVar12->scc == (SCC *)0x0) {
          iVar8 = pmVar12->index;
          iVar16 = local_d8->lowlink;
          goto LAB_00260a57;
        }
      }
      puVar20 = puVar20 + 1;
    } while (puVar20 !=
             (undefined8 *)
             CONCAT44(local_60._M_impl.super__Rb_tree_header._M_header._4_4_,
                      local_60._M_impl.super__Rb_tree_header._M_header._M_color));
  }
  if ((undefined8 *)local_60._M_impl._0_8_ != (undefined8 *)0x0) {
    operator_delete((void *)local_60._M_impl._0_8_);
  }
  if (local_d8->index == local_d8->lowlink) {
    local_98._0_8_ = operator_new(0x30);
    *(undefined8 *)
     &(((SCC *)local_98._0_8_)->descriptors).
      super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
         = 0;
    *(pointer *)
     ((long)&(((SCC *)local_98._0_8_)->descriptors).
             super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
     + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(((SCC *)local_98._0_8_)->descriptors).
             super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
     + 0x10) = (pointer)0x0;
    *(undefined8 *)
     &(((SCC *)local_98._0_8_)->children).
      super__Vector_base<const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
      ._M_impl = 0;
    *(pointer *)
     ((long)&(((SCC *)local_98._0_8_)->children).
             super__Vector_base<const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
     + 8) = (pointer)0x0;
    *(pointer *)
     ((long)&(((SCC *)local_98._0_8_)->children).
             super__Vector_base<const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
     + 0x10) = (pointer)0x0;
    __position._M_current =
         (this->garbage_bin_).
         super__Vector_base<std::unique_ptr<google::protobuf::compiler::SCC,_std::default_delete<google::protobuf::compiler::SCC>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::SCC,_std::default_delete<google::protobuf::compiler::SCC>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->garbage_bin_).
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::SCC,_std::default_delete<google::protobuf::compiler::SCC>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::SCC,_std::default_delete<google::protobuf::compiler::SCC>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::unique_ptr<google::protobuf::compiler::SCC,std::default_delete<google::protobuf::compiler::SCC>>,std::allocator<std::unique_ptr<google::protobuf::compiler::SCC,std::default_delete<google::protobuf::compiler::SCC>>>>
      ::_M_realloc_insert<google::protobuf::compiler::SCC*>
                ((vector<std::unique_ptr<google::protobuf::compiler::SCC,std::default_delete<google::protobuf::compiler::SCC>>,std::allocator<std::unique_ptr<google::protobuf::compiler::SCC,std::default_delete<google::protobuf::compiler::SCC>>>>
                  *)&this->garbage_bin_,__position,(SCC **)&local_98);
      puVar11 = (this->garbage_bin_).
                super__Vector_base<std::unique_ptr<google::protobuf::compiler::SCC,_std::default_delete<google::protobuf::compiler::SCC>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::SCC,_std::default_delete<google::protobuf::compiler::SCC>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      ((__position._M_current)->_M_t).
      super___uniq_ptr_impl<google::protobuf::compiler::SCC,_std::default_delete<google::protobuf::compiler::SCC>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::SCC_*,_std::default_delete<google::protobuf::compiler::SCC>_>
      .super__Head_base<0UL,_google::protobuf::compiler::SCC_*,_false>._M_head_impl =
           (SCC *)local_98._0_8_;
      puVar11 = (this->garbage_bin_).
                super__Vector_base<std::unique_ptr<google::protobuf::compiler::SCC,_std::default_delete<google::protobuf::compiler::SCC>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::SCC,_std::default_delete<google::protobuf::compiler::SCC>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 1;
      (this->garbage_bin_).
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::SCC,_std::default_delete<google::protobuf::compiler::SCC>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::SCC,_std::default_delete<google::protobuf::compiler::SCC>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar11;
    }
    this_00 = puVar11[-1]._M_t.
              super___uniq_ptr_impl<google::protobuf::compiler::SCC,_std::default_delete<google::protobuf::compiler::SCC>_>
              ._M_t.
              super__Tuple_impl<0UL,_google::protobuf::compiler::SCC_*,_std::default_delete<google::protobuf::compiler::SCC>_>
              .super__Head_base<0UL,_google::protobuf::compiler::SCC_*,_false>._M_head_impl;
    do {
      local_98._0_8_ =
           (this->stack_).
           super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1];
      iVar4._M_current =
           *(pointer *)
            ((long)&(this_00->descriptors).
                    super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
            + 8);
      if (iVar4._M_current ==
          *(pointer *)
           ((long)&(this_00->descriptors).
                   super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
           + 0x10)) {
        std::
        vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
        ::_M_realloc_insert<google::protobuf::Descriptor_const*const&>
                  ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                    *)this_00,iVar4,(Descriptor **)&local_98);
      }
      else {
        *iVar4._M_current = (Descriptor *)local_98._0_8_;
        pppDVar2 = (pointer *)
                   ((long)&(this_00->descriptors).
                           super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   + 8);
        *pppDVar2 = *pppDVar2 + 1;
      }
      pppDVar2 = &(this->stack_).
                  super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppDVar2 = *pppDVar2 + -1;
      pmVar12 = std::
                map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::NodeData>_>_>
                ::operator[](&this->cache_,(key_type *)&local_98);
      pmVar12->scc = this_00;
    } while ((SCC *)local_98._0_8_ != local_d0);
    ppDVar14 = *(pointer *)
                &(this_00->descriptors).
                 super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ;
    ppDVar5 = *(pointer *)
               ((long)&(this_00->descriptors).
                       super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               + 8);
    pDVar17 = extraout_RDX_00;
    if (ppDVar14 != ppDVar5) {
      uVar13 = (long)ppDVar5 - (long)ppDVar14 >> 3;
      lVar6 = 0x3f;
      if (uVar13 != 0) {
        for (; uVar13 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor_const**,std::vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::DFS(google::protobuf::Descriptor_const*)::_lambda(google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*)_1_>>
                (ppDVar14,ppDVar5,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)ppDVar5 - (long)ppDVar14 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor_const**,std::vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::DFS(google::protobuf::Descriptor_const*)::_lambda(google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*)_1_>>
                  (ppDVar14,ppDVar5);
        pDVar17 = extraout_RDX_03;
      }
      else {
        ppDVar18 = ppDVar14 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor_const**,std::vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::DFS(google::protobuf::Descriptor_const*)::_lambda(google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*)_1_>>
                  (ppDVar14,ppDVar18);
        pDVar17 = extraout_RDX_01;
        for (; ppDVar18 != ppDVar5; ppDVar18 = ppDVar18 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor_const**,std::vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::compiler::SCCAnalyzer<google::protobuf::compiler::js::(anonymous_namespace)::DepsGenerator>::DFS(google::protobuf::Descriptor_const*)::_lambda(google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*)_1_>>
                    (ppDVar18);
          pDVar17 = extraout_RDX_02;
        }
      }
    }
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    ppDVar14 = *(pointer *)
                &(this_00->descriptors).
                 super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ;
    local_b0 = *(pointer *)
                ((long)&(this_00->descriptors).
                        super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                + 8);
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (ppDVar14 != local_b0) {
      local_a0 = (vector<google::protobuf::compiler::SCC_const*,std::allocator<google::protobuf::compiler::SCC_const*>>
                  *)&this_00->children;
      do {
        local_a8 = ppDVar14;
        js::anon_unknown_0::DepsGenerator::operator()(&local_c8,(DepsGenerator *)*ppDVar14,pDVar17);
        ppDVar14 = local_c8.
                   super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        pDVar17 = extraout_RDX_04;
        for (pDVar19 = (Descriptor *)
                       local_c8.
                       super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; pDVar19 != (Descriptor *)ppDVar14;
            pDVar19 = pDVar19 + 8) {
          pDVar17 = *(Descriptor **)pDVar19;
          if (pDVar17 == (Descriptor *)0x0) {
            internal::LogMessage::LogMessage
                      (&local_98,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/scc.h"
                       ,0x90);
            pLVar9 = internal::LogMessage::operator<<(&local_98,"CHECK failed: child_msg: ");
            internal::LogFinisher::operator=(&local_d9,pLVar9);
            internal::LogMessage::~LogMessage(&local_98);
          }
          local_98._0_8_ = GetSCC(this,pDVar17);
          pDVar17 = extraout_RDX_05;
          if ((SCC *)local_98._0_8_ != this_00) {
            pVar22 = std::
                     _Rb_tree<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::SCC_const*,std::_Identity<google::protobuf::compiler::SCC_const*>,std::less<google::protobuf::compiler::SCC_const*>,std::allocator<google::protobuf::compiler::SCC_const*>>
                     ::_M_insert_unique<google::protobuf::compiler::SCC_const*const&>
                               ((_Rb_tree<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::SCC_const*,std::_Identity<google::protobuf::compiler::SCC_const*>,std::less<google::protobuf::compiler::SCC_const*>,std::allocator<google::protobuf::compiler::SCC_const*>>
                                 *)&local_60,(SCC **)&local_98);
            pDVar17 = pVar22._8_8_;
            if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              __position_00._M_current =
                   *(pointer *)
                    ((long)&(this_00->children).
                            super__Vector_base<const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
                    + 8);
              if (__position_00._M_current ==
                  *(pointer *)
                   ((long)&(this_00->children).
                           super__Vector_base<const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
                   + 0x10)) {
                std::
                vector<google::protobuf::compiler::SCC_const*,std::allocator<google::protobuf::compiler::SCC_const*>>
                ::_M_realloc_insert<google::protobuf::compiler::SCC_const*const&>
                          (local_a0,__position_00,(SCC **)&local_98);
                pDVar17 = extraout_RDX_06;
              }
              else {
                *__position_00._M_current = (SCC *)local_98._0_8_;
                pppSVar7 = (pointer *)
                           ((long)&(this_00->children).
                                   super__Vector_base<const_google::protobuf::compiler::SCC_*,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
                           + 8);
                *pppSVar7 = *pppSVar7 + 1;
              }
            }
          }
        }
        if ((Descriptor *)
            local_c8.
            super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start != (Descriptor *)0x0) {
          operator_delete(local_c8.
                          super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
          pDVar17 = extraout_RDX_07;
        }
        ppDVar14 = local_a8 + 1;
      } while (ppDVar14 != local_b0);
    }
    std::
    _Rb_tree<const_google::protobuf::compiler::SCC_*,_const_google::protobuf::compiler::SCC_*,_std::_Identity<const_google::protobuf::compiler::SCC_*>,_std::less<const_google::protobuf::compiler::SCC_*>,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
    ::~_Rb_tree(&local_60);
  }
  NVar21.scc = local_d8->scc;
  NVar21.index = local_d8->index;
  NVar21.lowlink = local_d8->lowlink;
  return NVar21;
}

Assistant:

NodeData DFS(const Descriptor* descriptor) {
    // Must not have visited already.
    GOOGLE_DCHECK_EQ(cache_.count(descriptor), 0);

    // Mark visited by inserting in map.
    NodeData& result = cache_[descriptor];
    // Initialize data structures.
    result.index = result.lowlink = index_++;
    stack_.push_back(descriptor);

    // Recurse the fields / nodes in graph
    for (auto dep : DepsGenerator()(descriptor)) {
      GOOGLE_CHECK(dep);
      if (cache_.count(dep) == 0) {
        // unexplored node
        NodeData child_data = DFS(dep);
        result.lowlink = std::min(result.lowlink, child_data.lowlink);
      } else {
        NodeData child_data = cache_[dep];
        if (child_data.scc == nullptr) {
          // Still in the stack_ so we found a back edge
          result.lowlink = std::min(result.lowlink, child_data.index);
        }
      }
    }
    if (result.index == result.lowlink) {
      // This is the root of a strongly connected component
      SCC* scc = CreateSCC();
      while (true) {
        const Descriptor* scc_desc = stack_.back();
        scc->descriptors.push_back(scc_desc);
        // Remove from stack
        stack_.pop_back();
        cache_[scc_desc].scc = scc;

        if (scc_desc == descriptor) break;
      }

      // The order of descriptors is random and depends how this SCC was
      // discovered. In-order to ensure maximum stability we sort it by name.
      std::sort(scc->descriptors.begin(), scc->descriptors.end(),
                [](const Descriptor* a, const Descriptor* b) {
                  return a->full_name() < b->full_name();
                });
      AddChildren(scc);
    }
    return result;
  }